

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O3

DMatrix<double> * __thiscall
gmath::DMatrix<double>::operator=(DMatrix<double> *this,DMatrix<double> *a)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  uint uVar4;
  double *pdVar5;
  int i;
  ulong uVar6;
  
  if (this->v != (double *)0x0) {
    operator_delete__(this->v);
  }
  iVar1 = a->nrows;
  this->nrows = iVar1;
  iVar2 = a->ncols;
  this->ncols = iVar2;
  uVar4 = iVar2 * iVar1;
  this->n = uVar4;
  this->v = (double *)0x0;
  if (0 < (int)uVar4) {
    pdVar5 = (double *)operator_new__((ulong)uVar4 * 8);
    this->v = pdVar5;
    pdVar3 = a->v;
    uVar6 = 0;
    do {
      pdVar5[uVar6] = pdVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return this;
}

Assistant:

DMatrix<T> &operator=(const DMatrix<T> &a)
    {
      if (v != 0)
      {
        delete [] v;
      }

      nrows=a.nrows;
      ncols=a.ncols;
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=a.v[i];
        }
      }

      return *this;
    }